

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# L2NormCost.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::L2NormCost::costSecondPartialDerivativeWRTControl
          (L2NormCost *this,double param_2,VectorDynSize *param_3,VectorDynSize *control,
          MatrixDynSize *partialDerivative)

{
  bool bVar1;
  string *in_stack_000002f0;
  MatrixDynSize *in_stack_000002f8;
  VectorDynSize *in_stack_00000300;
  CostAttributes *in_stack_00000308;
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  bVar1 = CostAttributes::getHessian
                    (in_stack_00000308,in_stack_00000300,in_stack_000002f8,in_stack_000002f0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffb8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffb7);
  return bVar1;
}

Assistant:

bool L2NormCost::costSecondPartialDerivativeWRTControl(double /*time*/, const VectorDynSize &/*state*/, const VectorDynSize &control, MatrixDynSize &partialDerivative)
        {
            return m_pimpl->controlCost.getHessian(control, partialDerivative, "control");
        }